

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSources::MultipleTimeouts
          (RTPSources *this,RTPTime *curtime,RTPTime *sendertimeout,RTPTime *byetimeout,
          RTPTime *generaltimeout,RTPTime *notetimeout)

{
  RTPTime *pRVar1;
  byte bVar2;
  bool bVar3;
  RTPInternalSourceData *this_00;
  HashElement *pHVar4;
  RTPMemoryManager *pRVar5;
  _func_int **pp_Var6;
  bool bVar7;
  bool bVar8;
  HashElement *pHVar9;
  int iVar10;
  HashElement *pHVar11;
  byte bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int local_5c;
  int local_58;
  
  dVar13 = curtime->m_t;
  dVar14 = dVar13 - sendertimeout->m_t;
  dVar15 = dVar13 - byetimeout->m_t;
  dVar16 = dVar13 - generaltimeout->m_t;
  dVar13 = dVar13 - notetimeout->m_t;
  pHVar9 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar9;
  if (pHVar9 == (HashElement *)0x0) {
    iVar10 = 0;
    local_5c = 0;
    local_58 = 0;
  }
  else {
    local_58 = 0;
    local_5c = 0;
    iVar10 = 0;
    do {
      this_00 = pHVar9->element;
      bVar2 = (this_00->super_RTPSourceData).receivedbye;
      bVar3 = (this_00->super_RTPSourceData).issender;
      bVar12 = (bVar2 ^ 1) & (this_00->super_RTPSourceData).validated;
      if (((this_00->super_RTPSourceData).SDESinf.nonprivateitems[6].length == 0) ||
         (pRVar1 = &(this_00->super_RTPSourceData).stats.lastnotetime,
         dVar13 < pRVar1->m_t || dVar13 == pRVar1->m_t)) {
        bVar7 = false;
      }
      else {
        RTPInternalSourceData::ClearNote(this_00);
        bVar2 = (this_00->super_RTPSourceData).receivedbye;
        bVar7 = true;
      }
      if ((((bVar2 & 1) == 0) || (this_00 == this->owndata)) ||
         (pRVar1 = &(this_00->super_RTPSourceData).byetime,
         dVar15 < pRVar1->m_t || dVar15 == pRVar1->m_t)) {
        if ((this_00 != this->owndata) &&
           (pRVar1 = &(this_00->super_RTPSourceData).stats.lastmsgtime,
           pRVar1->m_t <= dVar16 && dVar16 != pRVar1->m_t)) {
          pHVar9 = (this->sourcelist).curhashelem;
          if (pHVar9 != (HashElement *)0x0) {
            pHVar4 = pHVar9->hashprev;
            pHVar11 = pHVar9->hashnext;
            if (pHVar4 == (HashElement *)0x0) {
              (this->sourcelist).table[pHVar9->hashindex] = pHVar11;
            }
            else {
              pHVar4->hashnext = pHVar11;
            }
            if (pHVar11 != (HashElement *)0x0) {
              pHVar11->hashprev = pHVar4;
            }
            pHVar9 = (this->sourcelist).curhashelem;
            pHVar4 = pHVar9->listprev;
            pHVar11 = pHVar9->listnext;
            if (pHVar4 == (HashElement *)0x0) {
              (this->sourcelist).firsthashelem = pHVar11;
              if (pHVar11 == (HashElement *)0x0) {
                (this->sourcelist).lasthashelem = (HashElement *)0x0;
              }
              else {
                pHVar11->listprev = (HashElement *)0x0;
              }
            }
            else {
              pHVar4->listnext = pHVar11;
              if (pHVar11 == (HashElement *)0x0) {
                (this->sourcelist).lasthashelem = pHVar4;
              }
              else {
                pHVar11->listprev = pHVar4;
              }
            }
            pRVar5 = (this->sourcelist).super_RTPMemoryObject.mgr;
            if (pRVar5 == (RTPMemoryManager *)0x0) {
              operator_delete(pHVar9,0x30);
            }
            else {
              (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,pHVar9);
            }
            bVar8 = true;
            bVar7 = false;
            goto LAB_0011ee90;
          }
          bVar8 = true;
          bVar7 = false;
          goto LAB_0011ee9b;
        }
        if (bVar3 != false) {
          pRVar1 = &(this_00->super_RTPSourceData).stats.lastrtptime;
          if (dVar14 < pRVar1->m_t || dVar14 == pRVar1->m_t) {
            local_5c = local_5c + 1;
          }
          else {
            (this_00->super_RTPSourceData).issender = false;
            this->sendercount = this->sendercount + -1;
          }
        }
        if (bVar7) {
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x12])(this,this_00);
        }
        local_58 = local_58 + 1;
        iVar10 = iVar10 + (uint)bVar12;
        pHVar9 = (this->sourcelist).curhashelem;
        if (pHVar9 == (HashElement *)0x0) break;
        pHVar9 = pHVar9->listnext;
        (this->sourcelist).curhashelem = pHVar9;
      }
      else {
        pHVar9 = (this->sourcelist).curhashelem;
        if (pHVar9 == (HashElement *)0x0) {
          bVar7 = true;
          bVar8 = false;
        }
        else {
          pHVar4 = pHVar9->hashprev;
          pHVar11 = pHVar9->hashnext;
          if (pHVar4 == (HashElement *)0x0) {
            (this->sourcelist).table[pHVar9->hashindex] = pHVar11;
          }
          else {
            pHVar4->hashnext = pHVar11;
          }
          if (pHVar11 != (HashElement *)0x0) {
            pHVar11->hashprev = pHVar4;
          }
          pHVar9 = (this->sourcelist).curhashelem;
          pHVar4 = pHVar9->listprev;
          pHVar11 = pHVar9->listnext;
          if (pHVar4 == (HashElement *)0x0) {
            (this->sourcelist).firsthashelem = pHVar11;
            if (pHVar11 == (HashElement *)0x0) {
              (this->sourcelist).lasthashelem = (HashElement *)0x0;
            }
            else {
              pHVar11->listprev = (HashElement *)0x0;
            }
          }
          else {
            pHVar4->listnext = pHVar11;
            if (pHVar11 == (HashElement *)0x0) {
              (this->sourcelist).lasthashelem = pHVar4;
            }
            else {
              pHVar11->listprev = pHVar4;
            }
          }
          pRVar5 = (this->sourcelist).super_RTPMemoryObject.mgr;
          if (pRVar5 == (RTPMemoryManager *)0x0) {
            operator_delete(pHVar9,0x30);
          }
          else {
            (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,pHVar9);
          }
          bVar7 = true;
          bVar8 = false;
LAB_0011ee90:
          (this->sourcelist).curhashelem = pHVar11;
        }
LAB_0011ee9b:
        if (bVar3 != false) {
          this->sendercount = this->sendercount + -1;
        }
        if (bVar12 != 0) {
          this->activecount = this->activecount + -1;
        }
        this->totalcount = this->totalcount + -1;
        if (bVar7) {
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,this_00);
        }
        if (bVar8) {
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,this_00);
        }
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,this_00);
        pRVar5 = (this->super_RTPMemoryObject).mgr;
        pp_Var6 = (this_00->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject;
        if (pRVar5 == (RTPMemoryManager *)0x0) {
          (*pp_Var6[1])(this_00);
        }
        else {
          (**pp_Var6)(this_00);
          (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,this_00);
        }
        pHVar9 = (this->sourcelist).curhashelem;
      }
    } while (pHVar9 != (HashElement *)0x0);
  }
  this->totalcount = local_58;
  this->sendercount = local_5c;
  this->activecount = iVar10;
  return;
}

Assistant:

void RTPSources::MultipleTimeouts(const RTPTime &curtime,const RTPTime &sendertimeout,const RTPTime &byetimeout,const RTPTime &generaltimeout,const RTPTime &notetimeout)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime senderchecktime = curtime;
	RTPTime byechecktime = curtime;
	RTPTime generaltchecktime = curtime;
	RTPTime notechecktime = curtime;
	senderchecktime -= sendertimeout;
	byechecktime -= byetimeout;
	generaltchecktime -= generaltimeout;
	notechecktime -= notetimeout;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		bool deleted,issender,isactive;
		bool byetimeout,normaltimeout,notetimeout;
		
		size_t notelen;
		
		issender = srcdat->IsSender();
		isactive = srcdat->IsActive();
		deleted = false;
		byetimeout = false;
		normaltimeout = false;
		notetimeout = false;

        	srcdat->SDES_GetNote(&notelen);
		if (notelen != 0) // Note has been set
		{
			RTPTime notetime = srcdat->INF_GetLastSDESNoteTime();
			
			if (notechecktime > notetime)
			{
				notetimeout = true;
				srcdat->ClearNote();
			}
		}

		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (byechecktime > byetime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				byetimeout = true;
			}
		}

		if (!deleted)
		{
			RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

			if ((srcdat != owndata) && (lastmsgtime < generaltchecktime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				normaltimeout = true;
			}
		}
		
		if (!deleted)
		{
			newtotalcount++;
			
			if (issender)
			{
				RTPTime lastrtppacktime = srcdat->INF_GetLastRTPPacketTime();

				if (lastrtppacktime < senderchecktime)
				{
					srcdat->ClearSenderFlag();
					sendercount--;
				}
				else
					newsendercount++;
			}

			if (isactive)
				newactivecount++;

			if (notetimeout)
				OnNoteTimeout(srcdat);

			sourcelist.GotoNextElement();
		}
		else // deleted entry
		{
			if (issender)
				sendercount--;
			if (isactive)
				activecount--;
			totalcount--;

			if (byetimeout)
				OnBYETimeout(srcdat);
			if (normaltimeout)
				OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
	}	
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		SafeCountTotal();
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
	}
	if (newsendercount != sendercount)
	{
		SafeCountSenders();
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}